

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
celero::Printer::TableRowHeader(Printer *this,shared_ptr<celero::ExperimentResult> *x)

{
  Experiment *x_00;
  Printer *this_00;
  shared_ptr<celero::ExperimentResult> local_18;
  
  this_00 = (Printer *)
            (x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  x_00 = ExperimentResult::getExperiment((ExperimentResult *)this_00);
  TableRowExperimentHeader(this_00,x_00);
  local_18.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
          _M_pi;
  if (local_18.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_18.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_18.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  TableRowProblemSpaceHeader(this_00,&local_18);
  if (local_18.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    return;
  }
  return;
}

Assistant:

void Printer::TableRowHeader(std::shared_ptr<celero::ExperimentResult> x)
	{
		TableRowExperimentHeader(x->getExperiment());
		TableRowProblemSpaceHeader(x);
	}